

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O1

bool __thiscall
IRT::MoveRegToMemByRegPlusConst::TryToGenerateCode
          (MoveRegToMemByRegPlusConst *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  CMoveStatement *this_00;
  CExpression *pCVar3;
  CMemExpression *this_01;
  CBinopExpression *this_02;
  CTempExpression *this_03;
  CTempExpression *this_04;
  INode *pIVar4;
  CTemp rightRegister;
  CTemp leftRegister;
  undefined1 local_c9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  INode *local_a8;
  pair<IRT::CTemp,_const_IRT::INode_*> local_a0;
  CConstExpression *local_78;
  CTemp local_70;
  CTemp local_50;
  
  if (tree == (INode *)0x0) {
    this_00 = (CMoveStatement *)0x0;
  }
  else {
    this_00 = (CMoveStatement *)__dynamic_cast(tree,&INode::typeinfo,&CMoveStatement::typeinfo,0);
  }
  if (this_00 != (CMoveStatement *)0x0) {
    pCVar3 = CMoveStatement::Target(this_00);
    if (pCVar3 == (CExpression *)0x0) {
      this_01 = (CMemExpression *)0x0;
    }
    else {
      this_01 = (CMemExpression *)
                __dynamic_cast(pCVar3,&CExpression::typeinfo,&CMemExpression::typeinfo,0);
    }
    if (this_01 != (CMemExpression *)0x0) {
      pCVar3 = CMemExpression::getAddress(this_01);
      if (pCVar3 == (CExpression *)0x0) {
        this_02 = (CBinopExpression *)0x0;
      }
      else {
        this_02 = (CBinopExpression *)
                  __dynamic_cast(pCVar3,&CExpression::typeinfo,&CBinopExpression::typeinfo,0);
      }
      if (this_02 != (CBinopExpression *)0x0) {
        pCVar3 = CBinopExpression::getRightOperand(this_02);
        if (pCVar3 == (CExpression *)0x0) {
          local_78 = (CConstExpression *)0x0;
        }
        else {
          local_78 = (CConstExpression *)
                     __dynamic_cast(pCVar3,&CExpression::typeinfo,&CConstExpression::typeinfo,0);
        }
        if (local_78 != (CConstExpression *)0x0) {
          pCVar3 = CBinopExpression::getLeftOperand(this_02);
          if (pCVar3 == (CExpression *)0x0) {
            this_03 = (CTempExpression *)0x0;
          }
          else {
            this_03 = (CTempExpression *)
                      __dynamic_cast(pCVar3,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
          }
          pCVar3 = CMoveStatement::Source(this_00);
          if (pCVar3 == (CExpression *)0x0) {
            this_04 = (CTempExpression *)0x0;
          }
          else {
            this_04 = (CTempExpression *)
                      __dynamic_cast(pCVar3,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
          }
          CTemp::CTemp(&local_50);
          CTemp::CTemp(&local_70);
          if (this_03 == (CTempExpression *)0x0) {
            pIVar4 = (INode *)CBinopExpression::getLeftOperand(this_02);
            local_c8 = &local_b8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c8,local_50.name._M_dataplus._M_p,
                       local_50.name._M_dataplus._M_p + local_50.name._M_string_length);
            local_a0.first.name._M_dataplus._M_p = (pointer)&local_a0.first.name.field_2;
            if (local_c8 == &local_b8) {
              local_a0.first.name.field_2._8_8_ = local_b8._8_8_;
            }
            else {
              local_a0.first.name._M_dataplus._M_p = (pointer)local_c8;
            }
            local_a0.first.name.field_2._M_allocated_capacity._1_7_ =
                 local_b8._M_allocated_capacity._1_7_;
            local_a0.first.name.field_2._M_local_buf[0] = local_b8._M_local_buf[0];
            local_a0.first.name._M_string_length = (size_type)local_c0;
            local_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_b8._M_local_buf[0] = '\0';
            local_c8 = &local_b8;
            local_a8 = pIVar4;
            local_a0.second = pIVar4;
            std::
            vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
            ::emplace_back<std::pair<IRT::CTemp,IRT::INode_const*>>
                      ((vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
                        *)children,&local_a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0.first.name._M_dataplus._M_p != &local_a0.first.name.field_2) {
              operator_delete(local_a0.first.name._M_dataplus._M_p);
            }
            if (local_c8 != &local_b8) {
              operator_delete(local_c8);
            }
          }
          else {
            CTempExpression::getTemprorary(this_03);
            std::__cxx11::string::_M_assign((string *)&local_50);
          }
          if (this_04 == (CTempExpression *)0x0) {
            pIVar4 = (INode *)CMoveStatement::Source(this_00);
            local_c8 = &local_b8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c8,local_70.name._M_dataplus._M_p,
                       local_70.name._M_dataplus._M_p + local_70.name._M_string_length);
            paVar1 = &local_a0.first.name.field_2;
            if (local_c8 == &local_b8) {
              local_a0.first.name.field_2._8_8_ = local_b8._8_8_;
              local_a0.first.name._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_a0.first.name._M_dataplus._M_p = (pointer)local_c8;
            }
            local_a0.first.name.field_2._M_allocated_capacity._1_7_ =
                 local_b8._M_allocated_capacity._1_7_;
            local_a0.first.name.field_2._M_local_buf[0] = local_b8._M_local_buf[0];
            local_a0.first.name._M_string_length = (size_type)local_c0;
            local_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_b8._M_local_buf[0] = '\0';
            local_c8 = &local_b8;
            local_a8 = pIVar4;
            local_a0.second = pIVar4;
            std::
            vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
            ::emplace_back<std::pair<IRT::CTemp,IRT::INode_const*>>
                      ((vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
                        *)children,&local_a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0.first.name._M_dataplus._M_p != paVar1) {
              operator_delete(local_a0.first.name._M_dataplus._M_p);
            }
            if (local_c8 != &local_b8) {
              operator_delete(local_c8);
            }
          }
          else {
            CTempExpression::getTemprorary(this_04);
            std::__cxx11::string::_M_assign((string *)&local_70);
          }
          iVar2 = CConstExpression::getValue(local_78);
          local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)CONCAT44(local_c8._4_4_,iVar2);
          local_a0.first.name._M_dataplus._M_p = (pointer)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<AssemblyCode::MoveRegToMemByRegPlusConst,std::allocator<AssemblyCode::MoveRegToMemByRegPlusConst>,IRT::CTemp&,int,IRT::CTemp&>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_a0.first.name._M_string_length,(MoveRegToMemByRegPlusConst **)&local_a0,
                     (allocator<AssemblyCode::MoveRegToMemByRegPlusConst> *)&local_c9,&local_50,
                     (int *)&local_c8,&local_70);
          std::
          vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
          ::emplace_back<std::shared_ptr<AssemblyCode::MoveRegToMemByRegPlusConst>>
                    ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                      *)commands,(shared_ptr<AssemblyCode::MoveRegToMemByRegPlusConst> *)&local_a0);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.first.name._M_string_length
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_a0.first.name._M_string_length);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70.name._M_dataplus._M_p != &local_70.name.field_2) {
            operator_delete(local_70.name._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50.name._M_dataplus._M_p != &local_50.name.field_2) {
            operator_delete(local_50.name._M_dataplus._M_p);
          }
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool IRT::MoveRegToMemByRegPlusConst::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest,
                                                         ChildrenTemps &children, AssemblyCommands &commands ) {
    ConstMovePtr movePtr = dynamic_cast<ConstMovePtr>(tree);
    if ( movePtr ) {
        ConstMemPtr memPtr = dynamic_cast<ConstMemPtr>(movePtr->Target( ));
        if ( memPtr ) {
            ConstBinopPtr binopPtr = dynamic_cast<ConstBinopPtr>(memPtr->getAddress( ));
            if ( binopPtr ) {
                ConstConstPtr constPtr = dynamic_cast<ConstConstPtr>(binopPtr->getRightOperand( ));
                if ( constPtr ) {
                    ConstTempPtr targetRegPtr = dynamic_cast<ConstTempPtr>(binopPtr->getLeftOperand( ));
                    ConstTempPtr sourceRegPtr = dynamic_cast<ConstTempPtr>(movePtr->Source( ));
                    CTemp leftRegister;
                    CTemp rightRegister;
                    if ( !targetRegPtr ) {
                        children.push_back( std::make_pair( leftRegister, binopPtr->getLeftOperand( )));
                    } else {
                        leftRegister = targetRegPtr->getTemprorary( );
                    }
                    if ( !sourceRegPtr ) {
                        children.push_back( std::make_pair( rightRegister, movePtr->Source( )));
                    } else {
                        rightRegister = sourceRegPtr->getTemprorary( );
                    }
                    commands.emplace_back( std::make_shared<AssemblyCode::MoveRegToMemByRegPlusConst>( leftRegister,
                                                                                                       constPtr->getValue( ),
                                                                                                       rightRegister ));
                    return true;
                }
            }
        }
    }
    return false;
}